

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyimpl.cpp
# Opt level: O2

void __thiscall QNetworkReplyImplPrivate::metaDataChanged(QNetworkReplyImplPrivate *this)

{
  QNetworkReply *this_00;
  bool bVar1;
  int iVar2;
  QNetworkCookieJar *pQVar3;
  long in_FS_OFFSET;
  QArrayDataPointer<QNetworkCookie> local_b8;
  _Storage<QList<QNetworkCookie>,_false> local_98;
  undefined1 *puStack_80;
  undefined1 local_78 [32];
  QVariant local_58;
  QObject *local_38;
  
  local_38 = *(QObject **)(in_FS_OFFSET + 0x28);
  this_00 = *(QNetworkReply **)&(this->super_QNetworkReplyPrivate).field_0x8;
  bVar1 = QWeakPointer<QObject>::isNull(&(this->super_QNetworkReplyPrivate).manager.wp);
  if (!bVar1) {
    local_98._M_value.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
    local_98._M_value.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_98._M_value.d.ptr = (QNetworkCookie *)&DAT_aaaaaaaaaaaaaaaa;
    QNetworkHeadersPrivate::headers((QNetworkHeadersPrivate *)local_78);
    QHttpHeaders::values((QList<QByteArray> *)&local_58,(QHttpHeaders *)local_78,SetCookie);
    QNetworkHeadersPrivate::toSetCookieList
              ((optional<QList<QNetworkCookie>_> *)&local_98._M_value,(QList<QByteArray> *)&local_58
              );
    QArrayDataPointer<QByteArray>::~QArrayDataPointer((QArrayDataPointer<QByteArray> *)&local_58);
    QHttpHeaders::~QHttpHeaders((QHttpHeaders *)local_78);
    local_b8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_b8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_b8.ptr = (QNetworkCookie *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.data.shared = (PrivateShared *)0x0;
    local_58.d.data._8_8_ = (Data *)0x0;
    local_58.d.data._16_8_ = (Data *)0x0;
    std::optional<QList<QNetworkCookie>>::value_or<QList<QNetworkCookie>>
              ((QList<QNetworkCookie> *)&local_b8,&local_98,(QList<QNetworkCookie> *)&local_58);
    QArrayDataPointer<QNetworkCookie>::~QArrayDataPointer
              ((QArrayDataPointer<QNetworkCookie> *)&local_58);
    if ((undefined1 *)local_b8.size != (undefined1 *)0x0) {
      QVariant::QVariant((QVariant *)local_78,0);
      QNetworkRequest::attribute
                (&local_58,&(this->super_QNetworkReplyPrivate).request,CookieSaveControlAttribute,
                 (QVariant *)local_78);
      iVar2 = QVariant::toInt((bool *)&local_58);
      QVariant::~QVariant(&local_58);
      QVariant::~QVariant((QVariant *)local_78);
      if (iVar2 == 0) {
        pQVar3 = QNetworkAccessManager::cookieJar
                           ((QNetworkAccessManager *)
                            (this->super_QNetworkReplyPrivate).manager.wp.value);
        if (pQVar3 != (QNetworkCookieJar *)0x0) {
          (**(code **)(*(long *)pQVar3 + 0x68))
                    (pQVar3,&local_b8,&(this->super_QNetworkReplyPrivate).url);
        }
      }
    }
    QArrayDataPointer<QNetworkCookie>::~QArrayDataPointer(&local_b8);
    std::_Optional_payload_base<QList<QNetworkCookie>_>::_M_reset
              ((_Optional_payload_base<QList<QNetworkCookie>_> *)&local_98._M_value);
  }
  QNetworkReply::metaDataChanged(this_00);
  if (*(QObject **)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QNetworkReplyImplPrivate::metaDataChanged()
{
    Q_Q(QNetworkReplyImpl);
    // 1. do we have cookies?
    // 2. are we allowed to set them?
    if (!manager.isNull()) {
        const auto cookiesOpt = QNetworkHeadersPrivate::toSetCookieList(
                headers().values(QHttpHeaders::WellKnownHeader::SetCookie));
        const auto cookies = cookiesOpt.value_or(QList<QNetworkCookie>());
        if (!cookies.empty()
            && request.attribute(QNetworkRequest::CookieSaveControlAttribute,
                                 QNetworkRequest::Automatic).toInt() == QNetworkRequest::Automatic) {
            QNetworkCookieJar *jar = manager->cookieJar();
            if (jar) {
                jar->setCookiesFromUrl(cookies, url);
            }
        }
    }

    emit q->metaDataChanged();
}